

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void i4_factorial2_values(int *n_data,int *n,int *fn)

{
  int local_a8 [2];
  int n_vec [16];
  int fn_vec [16];
  int *fn_local;
  int *n_local;
  int *n_data_local;
  
  memcpy(n_vec + 0xe,&DAT_00264c10,0x40);
  memcpy(local_a8,&DAT_00264c50,0x40);
  if (*n_data < 0) {
    *n_data = 0;
  }
  *n_data = *n_data + 1;
  if (*n_data < 0x11) {
    *n = n_vec[(long)(*n_data + -1) + -2];
    *fn = n_vec[(long)(*n_data + -1) + 0xe];
  }
  else {
    *n_data = 0;
    *n = 0;
    *fn = 0;
  }
  return;
}

Assistant:

void i4_factorial2_values ( int *n_data, int *n, int *fn )

//****************************************************************************80
//
//  Purpose: 
//
//    I4_FACTORIAL2_VALUES returns values of the double factorial function.
//
//  Discussion:
//
//    The formula is:
//
//      FACTORIAL2( N ) = Product ( N * (N-2) * (N-4) * ... * 2 )  (N even)
//                      = Product ( N * (N-2) * (N-4) * ... * 1 )  (N odd)
//
//  Example:
//
//     N    FACTORIAL2(N)
//
//     0     1
//     1     1
//     2     2
//     3     3
//     4     8
//     5    15
//     6    48
//     7   105
//     8   384
//     9   945
//    10  3840
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    14 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Daniel Zwillinger,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996, page 16.
//
//  Parameters:
//
//    Input/output, int *N_DATA.  The user sets N_DATA to 0 before the
//    first call.  On each call, the routine increments N_DATA by 1, and
//    returns the corresponding data; when there is no more data, the
//    output value of N_DATA will be 0 again.
//
//    Output, int *N, the argument of the function.
//
//    Output, int *FN, the value of the function.
//
{
# define N_MAX 16

  int fn_vec[N_MAX] = { 
        1, 
        1,     2,      3,      8,      15, 
       48,   105,    384,    945,    3840, 
    10395, 46080, 135135, 645120, 2027025 };
  int n_vec[N_MAX] = { 
     0, 
     1,  2,  3,  4,  5, 
     6,  7,  8,  9, 10, 
    11, 12, 13, 14, 15 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  *n_data = *n_data + 1;

  if ( N_MAX < *n_data )
  {
    *n_data = 0;
    *n = 0;
    *fn = 0;
  }
  else
  {
    *n = n_vec[*n_data-1];
    *fn = fn_vec[*n_data-1];
  }
  return;
# undef N_MAX
}